

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_spec.cc
# Opt level: O0

void anon_unknown.dwarf_2934::PrintUsage(ostream *stream)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  char *pcVar4;
  ostream *in_RDI;
  
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," pitch_spec - pitch-adaptive spectral estimation");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  usage:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       pitch_spec [ options ] f0file [ infile ] > stdout");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  options:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -a a  : algorithm used for  (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= a <= 0    ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"               spectrum estimation");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 0 (WORLD)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -l l  : FFT length          (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x400);
  poVar2 = std::operator<<(poVar2,"][   4 <= l <=      ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -p p  : frame shift [point] (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x50);
  poVar2 = std::operator<<(poVar2,"][   1 <= p <=      ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -s s  : sampling rate [kHz] (double)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,16.0);
  poVar2 = std::operator<<(poVar2,"][ 8.0 <= s <= 98.0 ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -q q  : f0 input format     (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= q <= 2    ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 0 (Fs/F0)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 1 (F0)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 2 (log F0)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -o o  : output format       (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= o <= 3    ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 0 (20*log|H(z)|)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 1 (ln|H(z)|)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 2 (|H(z)|)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"                 3 (|H(z)|^2)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -x    : skip f0 refinement  (  bool)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  pcVar4 = sptk::ConvertBooleanToString(false);
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -h    : print this message");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  infile:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       waveform                    (double)[stdin]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  f0file:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       pitch                       (double)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  stdout:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       spectrum                    (double)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  notice:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       value of l must be a power of 2");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,
                           "       magic number representing unvoiced symbol is 0 (q = 0, 1) or -1e+10 (q = 2)"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " pitch_spec - pitch-adaptive spectral estimation" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       pitch_spec [ options ] f0file [ infile ] > stdout" << std::endl;  // NOLINT
  *stream << "  options:" << std::endl;
  *stream << "       -a a  : algorithm used for  (   int)[" << std::setw(5) << std::right << kDefaultAlgorithm    << "][   0 <= a <= 0    ]" << std::endl;  // NOLINT
  *stream << "               spectrum estimation" << std::endl;
  *stream << "                 0 (WORLD)" << std::endl;
  *stream << "       -l l  : FFT length          (   int)[" << std::setw(5) << std::right << kDefaultFftLength    << "][   4 <= l <=      ]" << std::endl;  // NOLINT
  *stream << "       -p p  : frame shift [point] (   int)[" << std::setw(5) << std::right << kDefaultFrameShift   << "][   1 <= p <=      ]" << std::endl;  // NOLINT
  *stream << "       -s s  : sampling rate [kHz] (double)[" << std::setw(5) << std::right << kDefaultSamplingRate << "][ 8.0 <= s <= 98.0 ]" << std::endl;  // NOLINT
  *stream << "       -q q  : f0 input format     (   int)[" << std::setw(5) << std::right << kDefaultInputFormat  << "][   0 <= q <= 2    ]" << std::endl;  // NOLINT
  *stream << "                 0 (Fs/F0)" << std::endl;
  *stream << "                 1 (F0)" << std::endl;
  *stream << "                 2 (log F0)" << std::endl;
  *stream << "       -o o  : output format       (   int)[" << std::setw(5) << std::right << kDefaultOutputFormat << "][   0 <= o <= 3    ]" << std::endl;  // NOLINT
  *stream << "                 0 (20*log|H(z)|)" << std::endl;
  *stream << "                 1 (ln|H(z)|)" << std::endl;
  *stream << "                 2 (|H(z)|)" << std::endl;
  *stream << "                 3 (|H(z)|^2)" << std::endl;
  *stream << "       -x    : skip f0 refinement  (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(!kDefaultF0Refinement) << "]" << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       waveform                    (double)[stdin]" << std::endl;
  *stream << "  f0file:" << std::endl;
  *stream << "       pitch                       (double)" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       spectrum                    (double)" << std::endl;
  *stream << "  notice:" << std::endl;
  *stream << "       value of l must be a power of 2" << std::endl;
  *stream << "       magic number representing unvoiced symbol is 0 (q = 0, 1) or -1e+10 (q = 2)" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}